

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::crn_unpacker::decode_palettes(crn_unpacker *this)

{
  bool bVar1;
  uint uVar2;
  crn_unpacker *this_local;
  
  uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&(this->m_pHeader->m_color_endpoints).m_num);
  if (uVar2 != 0) {
    bVar1 = decode_color_endpoints(this);
    if (!bVar1) {
      return false;
    }
    bVar1 = decode_color_selectors(this);
    if (!bVar1) {
      return false;
    }
  }
  uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&(this->m_pHeader->m_alpha_endpoints).m_num);
  if (uVar2 != 0) {
    bVar1 = decode_alpha_endpoints(this);
    if (!bVar1) {
      return false;
    }
    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                      ((crn_packed_uint *)&this->m_pHeader->m_format);
    if (uVar2 != 0xe) {
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&this->m_pHeader->m_format);
      if (uVar2 == 0xc) {
        bVar1 = decode_alpha_selectors_etc(this);
        if (bVar1) {
          return true;
        }
      }
      else {
        bVar1 = decode_alpha_selectors(this);
        if (bVar1) {
          return true;
        }
      }
      return false;
    }
    bVar1 = decode_alpha_selectors_etcs(this);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool decode_palettes()
        {
            if (m_pHeader->m_color_endpoints.m_num)
            {
                if (!decode_color_endpoints())
                    return false;
                if (!decode_color_selectors())
                    return false;
            }

            if (m_pHeader->m_alpha_endpoints.m_num)
            {
                if (!decode_alpha_endpoints())
                    return false;
                if (!(m_pHeader->m_format == cCRNFmtETC2AS ? decode_alpha_selectors_etcs() : m_pHeader->m_format == cCRNFmtETC2A ? decode_alpha_selectors_etc() : decode_alpha_selectors()))
                    return false;
            }

            return true;
        }